

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O2

int ui_entry_combiner_lookup(char *name)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = 9;
  iVar4 = 0;
  while( true ) {
    if (iVar4 == (int)uVar5) {
      return 0;
    }
    uVar1 = (long)(iVar4 + (int)uVar5) / 2;
    iVar2 = (int)uVar1;
    iVar3 = strcmp(combiners[iVar2].name,name);
    if (iVar3 == 0) break;
    if (-1 < iVar3) {
      uVar5 = uVar1;
    }
    uVar5 = uVar5 & 0xffffffff;
    if (-1 >= iVar3) {
      iVar4 = iVar2 + 1;
    }
  }
  return iVar2 + 1;
}

Assistant:

int ui_entry_combiner_lookup(const char *name)
{
	/* Sorted alphabetically so use a binary search. */
	int ilow = 0, ihigh = N_ELEMENTS(combiners);

	while (1) {
		int imid, cmp;

		if (ilow == ihigh) {
			return 0;
		}
		imid = (ilow + ihigh) / 2;
		cmp = strcmp(combiners[imid].name, name);
		if (cmp == 0) {
			return imid + 1;
		}
		if (cmp < 0) {
			ilow = imid + 1;
		} else {
			ihigh = imid;
		}
	}
}